

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits)

{
  Result RVar1;
  Enum EVar2;
  Location loc;
  MemoryDesc local_38;
  
  loc.field_1._8_8_ = loc.field_1._8_8_ & 0xffffffff00000000;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnMemory(&this->validator_,&loc,limits);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)limits->initial;
    loc.field_1._8_8_ = limits->max;
    local_38.type.limits.has_max = limits->has_max;
    local_38.type.limits.is_shared = limits->is_shared;
    local_38.type.limits.is_64 = limits->is_64;
    local_38.type.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
    loc.filename._M_str = (char *)CONCAT44(loc.filename._M_str._4_4_,2);
    loc.filename._M_len = (size_t)&PTR__ExternType_00180180;
    if (((limits->has_max & 1U) == 0) && (loc.field_1._8_8_ = 0x10000, (limits->is_64 & 1U) != 0)) {
      loc.field_1._8_8_ = 0x1000000000000;
    }
    local_38.type.super_ExternType.kind = Memory;
    local_38.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00180180;
    local_38.type.limits.max = loc.field_1._8_8_;
    local_38.type.limits.initial = (uint64_t)loc.field_1.field_1.offset;
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
    emplace_back<wabt::interp::MemoryDesc>(&this->module_->memories,&local_38);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)&loc);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index, const Limits* limits) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits));
  MemoryType memory_type{*limits};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}